

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryControllersLoader.cpp
# Opt level: O0

void __thiscall
COLLADASaxFWL::LibraryControllersLoader::LibraryControllersLoader
          (LibraryControllersLoader *this,IFilePartLoader *callingFilePartLoader)

{
  IFilePartLoader *in_RDI;
  SourceArrayLoader *in_stack_ffffffffffffffe0;
  
  SourceArrayLoader::SourceArrayLoader(in_stack_ffffffffffffffe0,in_RDI);
  (in_RDI->super_ExtraDataLoader)._vptr_ExtraDataLoader =
       (_func_int **)&PTR__LibraryControllersLoader_00e625b8;
  *(undefined4 *)&in_RDI[5].mParserImpl = 0;
  std::__cxx11::string::string((string *)(in_RDI + 6));
  std::__cxx11::string::string((string *)&in_RDI[7].mPartLoader);
  COLLADAFW::UniqueId::UniqueId((UniqueId *)&in_RDI[8].mParserImpl);
  std::__cxx11::string::string((string *)&in_RDI[9].mParserImpl);
  in_RDI[0xb].super_ExtraDataLoader._vptr_ExtraDataLoader = (_func_int **)0x0;
  in_RDI[0xb].mPartLoader = (IFilePartLoader *)0x0;
  *(undefined4 *)&in_RDI[0xb].mParserImpl = 0;
  in_RDI[0xc].super_ExtraDataLoader._vptr_ExtraDataLoader = (_func_int **)0x0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         *)0xc380d1);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         *)0xc380e2);
  in_RDI[0x10].mPartLoader = (IFilePartLoader *)0x0;
  in_RDI[0x10].mParserImpl = (IParserImpl *)0x0;
  in_RDI[0x11].super_ExtraDataLoader._vptr_ExtraDataLoader = (_func_int **)0x0;
  in_RDI[0x11].mPartLoader = (IFilePartLoader *)0x0;
  in_RDI[0x11].mParserImpl = (IParserImpl *)0x0;
  memcpy(in_RDI + 0x12,COLLADABU::Math::Matrix4::IDENTITY,0x88);
  in_RDI[0x17].mParserImpl = (IParserImpl *)0x0;
  *(undefined1 *)&in_RDI[0x18].super_ExtraDataLoader._vptr_ExtraDataLoader = 1;
  return;
}

Assistant:

LibraryControllersLoader::LibraryControllersLoader( IFilePartLoader* callingFilePartLoader )
		: SourceArrayLoader(callingFilePartLoader)
		, mCurrentControllerType( UNKNOWN_CONTROLLER )
		, mCurrentSkinControllerData(0)
		, mCurrentMorphController(0)
		, mCurrentInputParent( INPUT_PARENT_UNKNOWN )
		, mJointSidsOrIds( 0 )
		, mCurrentJointsVertexPairCount( 0 )
		, mJointOffset(0)
		, mWeightsOffset(0)
		, mCurrentMaxOffset(0)
		, mCurrentOffset(0)
		, mCurrentBindShapeMatrix( COLLADABU::Math::Matrix4::IDENTITY)
		, mCurrentMatrixIndex(0)
		, mVerboseValidate(true)
	{}